

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

void __thiscall
cfd::core::ScriptElement::ScriptElement(ScriptElement *this,int64_t value,bool is_binary)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  ByteData local_38;
  byte local_19;
  int64_t iStack_18;
  bool is_binary_local;
  int64_t value_local;
  ScriptElement *this_local;
  
  local_19 = is_binary;
  iStack_18 = value;
  value_local = (int64_t)this;
  ScriptElement(this,value);
  if (((local_19 & 1) != 0) && (this->type_ == kElementOpCode)) {
    this->type_ = kElementNumber;
    SerializeScriptNum(&local_50,this->value_);
    ByteData::ByteData(&local_38,&local_50);
    ByteData::operator=(&this->binary_data_,&local_38);
    ByteData::~ByteData(&local_38);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50);
  }
  return;
}

Assistant:

ScriptElement::ScriptElement(int64_t value, bool is_binary)
    : ScriptElement(value) {
  if (is_binary && type_ == kElementOpCode) {
    type_ = kElementNumber;
    binary_data_ = ByteData(SerializeScriptNum(value_));
  }
}